

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRouter.h
# Opt level: O3

bool __thiscall
uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::route
          (HttpRouter<uWS::HttpContextData<true>::RouterData> *this,string_view method,
          string_view url)

{
  pointer puVar1;
  Node *parent;
  byte bVar2;
  byte bVar3;
  int iVar4;
  size_t sVar5;
  size_t __n;
  pointer puVar6;
  
  sVar5 = url._M_len;
  __n = method._M_len;
  (this->currentUrl)._M_len = sVar5;
  (this->currentUrl)._M_str = url._M_str;
  this->urlSegmentTop = -1;
  (this->routeParameters).paramsTop = -1;
  puVar6 = (this->root).children.
           super__Vector_base<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->root).children.
           super__Vector_base<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar6 == puVar1) {
      bVar3 = (byte)sVar5;
      bVar2 = 0;
LAB_0014af0f:
      return (bool)(bVar2 & bVar3);
    }
    parent = (puVar6->_M_t).
             super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>
             ._M_t.
             super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>
             .
             super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node_*,_false>
             ._M_head_impl;
    if (((parent->name)._M_string_length == __n) &&
       ((__n == 0 || (iVar4 = bcmp((parent->name)._M_dataplus._M_p,method._M_str,__n), iVar4 == 0)))
       ) {
      bVar3 = executeHandlers(this,parent,0,&this->userData);
      bVar2 = 1;
      goto LAB_0014af0f;
    }
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

inline void setUrl(std::string_view url) {

        /* Todo: URL may also start with "http://domain/" or "*", not only "/" */

        /* We expect to stand on a slash */
        currentUrl = url;
        urlSegmentTop = -1;
    }